

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::HashAggregateLocalSourceState::HashAggregateLocalSourceState
          (HashAggregateLocalSourceState *this,ExecutionContext *context,PhysicalHashAggregate *op)

{
  pointer pHVar1;
  pointer context_00;
  GroupingSet *local_30;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__HashAggregateLocalSourceState_01994fe8;
  (this->radix_idx).index = 0xffffffffffffffff;
  (this->radix_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->radix_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->radix_states).
  super_vector<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  context_00 = (op->groupings).
               super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
               .
               super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (op->groupings).
           super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
           .
           super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (context_00 != pHVar1) {
    do {
      RadixPartitionedHashTable::GetLocalSourceState
                ((RadixPartitionedHashTable *)&stack0xffffffffffffffd0,
                 (ExecutionContext *)context_00);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::LocalSourceState,std::default_delete<duckdb::LocalSourceState>,true>>>
                  *)&this->radix_states,
                 (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
                  *)&stack0xffffffffffffffd0);
      if (local_30 != (GroupingSet *)0x0) {
        (**(code **)(*(long *)&(local_30->_M_t)._M_impl + 8))();
      }
      context_00 = context_00 + 1;
    } while (context_00 != pHVar1);
  }
  return;
}

Assistant:

explicit HashAggregateLocalSourceState(ExecutionContext &context, const PhysicalHashAggregate &op) {
		for (auto &grouping : op.groupings) {
			auto &rt = grouping.table_data;
			radix_states.push_back(rt.GetLocalSourceState(context));
		}
	}